

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

longlong Utils::vectEightBytesToUnsignedInt
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *vec,int pos)

{
  pointer puVar1;
  long lVar2;
  
  lVar2 = (long)pos;
  puVar1 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  return CONCAT44(puVar1[lVar2 + 1] << 0x10 | puVar1[lVar2] << 0x18 | puVar1[lVar2 + 3] |
                  puVar1[lVar2 + 2] << 8,
                  puVar1[lVar2 + 5] << 0x10 | puVar1[lVar2 + 4] << 0x18 | puVar1[lVar2 + 7] |
                  puVar1[lVar2 + 6] << 8);
}

Assistant:

long long int Utils::vectEightBytesToUnsignedInt(std::vector<unsigned int> vec, int pos) {
    unsigned int result = (vec[pos+0] << 8) | vec[pos+1];
    unsigned int result2 = (vec[pos+2] << 8) | vec[pos+3];
    long long int result3 = (result << 16) | result2;

    unsigned int result4 = (vec[pos+4] << 8) | vec[pos+5];
    unsigned int result5 = (vec[pos+6] << 8) | vec[pos+7];
    long long int result6 = (result4 << 16) | result5;

    long long int result7 = (result3 << 32) | result6;
    return  result7;
}